

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall
parser::memo::any::bind<std::__cxx11::string>
          (any *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v)

{
  bool bVar1;
  string *in_RSI;
  type_info *in_RDI;
  type_info *unaff_retaddr;
  type_info *__arg;
  
  __arg = in_RDI;
  type((any *)in_RSI);
  bVar1 = std::type_info::operator==(unaff_retaddr,__arg);
  if (bVar1) {
    std::__cxx11::string::operator=(in_RSI,(string *)(*(long *)in_RDI + 8));
  }
  return;
}

Assistant:

void bind(T& v) {
				if ( type() == typeid(T) ) {
					v = static_cast<of<T>*>(p)->v;
				}
			}